

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

Aig_Man_t * Saig_BmcIntervalToAig(Saig_Bmc_t *p)

{
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  void *pvVar1;
  Aig_Man_t *pNew;
  Aig_Obj_t *pDriver;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    p_00 = p->pFrm->vObjs;
    if (p_00->nSize <= iVar2) {
      pNew = Aig_ManStart(p->nNodesMax);
      p->pFrm->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
      p_01 = p->vVisited;
      p_01->nSize = 0;
      Vec_IntPush(p_01,p->pFrm->pConst1->Id);
      iVar2 = 0;
      while( true ) {
        if (p->vTargets->nSize <= iVar2) {
          return pNew;
        }
        pvVar1 = Vec_PtrEntry(p->vTargets,iVar2);
        pDriver = Saig_BmcIntervalToAig_rec
                            (p,pNew,(Aig_Obj_t *)((ulong)pvVar1 & 0xfffffffffffffffe));
        if (((ulong)pDriver & 1) != 0) break;
        Aig_ObjCreateCo(pNew,pDriver);
        iVar2 = iVar2 + 1;
      }
      __assert_fail("!Aig_IsComplement(pObjNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                    ,0x22b,"Aig_Man_t *Saig_BmcIntervalToAig(Saig_Bmc_t *)");
    }
    pvVar1 = Vec_PtrEntry(p_00,iVar2);
    if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 0x28) != 0)) break;
    iVar2 = iVar2 + 1;
  }
  __assert_fail("pObj->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                ,0x221,"Aig_Man_t *Saig_BmcIntervalToAig(Saig_Bmc_t *)");
}

Assistant:

Aig_Man_t * Saig_BmcIntervalToAig( Saig_Bmc_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    Aig_ManForEachObj( p->pFrm, pObj, i )
        assert( pObj->pData == NULL );

    pNew = Aig_ManStart( p->nNodesMax );
    Aig_ManConst1(p->pFrm)->pData = Aig_ManConst1(pNew);
    Vec_IntClear( p->vVisited );
    Vec_IntPush( p->vVisited, Aig_ObjId(Aig_ManConst1(p->pFrm)) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTargets, pObj, i )
    {
//        assert( !Aig_ObjIsConst1(Aig_Regular(pObj)) );
        pObjNew = Saig_BmcIntervalToAig_rec( p, pNew, Aig_Regular(pObj) );
        assert( !Aig_IsComplement(pObjNew) );
        Aig_ObjCreateCo( pNew, pObjNew );
    } 
    return pNew;
}